

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_seq_oc(void)

{
  undefined4 uVar1;
  clock_t cVar2;
  clock_t cVar3;
  undefined1 local_c90 [8];
  dsfmt_t dsfmt;
  double total;
  double r;
  double *array;
  uint64_t sum;
  uint64_t clo;
  uint32_t k;
  uint32_t j;
  uint32_t i;
  double *psfmt64_1;
  double r_2;
  double *psfmt64;
  double r_1;
  
  dsfmt.idx = 0;
  dsfmt._3076_4_ = 0;
  dsfmt_chk_init_gen_rand((dsfmt_t *)local_c90,0x4d2,0x4de1);
  array = (double *)0x0;
  total = 0.0;
  for (k = 0; k < 10; k = k + 1) {
    cVar2 = clock();
    for (clo._4_4_ = 0; clo._4_4_ < 2000; clo._4_4_ = clo._4_4_ + 1) {
      for (clo._0_4_ = 0; (uint)clo < 50000; clo._0_4_ = (uint)clo + 1) {
        if (0x17d < (int)dsfmt.status[0xbf].u32[2]) {
          dsfmt_gen_rand_all((dsfmt_t *)local_c90);
          dsfmt.status[0xbf].u32[2] = 0;
        }
        uVar1 = dsfmt.status[0xbf].u32[2];
        dsfmt.status[0xbf].u32[2] = dsfmt.status[0xbf].u32[2] + 1;
        total = (2.0 - ((dsfmt_t *)local_c90)->status[0].d[(int)uVar1]) + total;
      }
    }
    cVar3 = clock();
    array = (double *)((cVar3 - cVar2) + (long)array);
  }
  dsfmt._3072_8_ = total + (double)dsfmt._3072_8_;
  printf("ST SEQ (0, 1] 1 AVE:%4lums.\n",(ulong)((long)array * 100) / 1000000,
         (ulong)((long)array * 100) % 1000000);
  array = (double *)0x0;
  for (k = 0; k < 10; k = k + 1) {
    cVar2 = clock();
    for (clo._4_4_ = 0; clo._4_4_ < 2000; clo._4_4_ = clo._4_4_ + 1) {
      for (clo._0_4_ = 0; (uint)clo < 50000; clo._0_4_ = (uint)clo + 1) {
        if (0x17d < (int)dsfmt.status[0xbf].u32[2]) {
          dsfmt_gen_rand_all((dsfmt_t *)local_c90);
          dsfmt.status[0xbf].u32[2] = 0;
        }
        uVar1 = dsfmt.status[0xbf].u32[2];
        dsfmt.status[0xbf].u32[2] = dsfmt.status[0xbf].u32[2] + 1;
        dummy[0].d[(uint)clo] = 2.0 - ((dsfmt_t *)local_c90)->status[0].d[(int)uVar1];
      }
    }
    cVar3 = clock();
    array = (double *)((cVar3 - cVar2) + (long)array);
  }
  for (clo._0_4_ = 0; (uint)clo < 50000; clo._0_4_ = (uint)clo + 1) {
    dsfmt._3072_8_ = dummy[0].d[(uint)clo] + (double)dsfmt._3072_8_;
  }
  printf("ST SEQ (0, 1] 2 AVE:%4lums.\n",(ulong)((long)array * 100) / 1000000,
         (ulong)((long)array * 100) % 1000000);
  printf("total = %f\n",dsfmt._3072_8_);
  return;
}

Assistant:

static void test_seq_oc(void) {
    uint32_t i, j, k;
    uint64_t clo;
    uint64_t sum;
    double *array = (double *)dummy;
    double r;
    double total = 0;
    dsfmt_t dsfmt;
#if 0
    dsfmt_gv_init_gen_rand(1234);
    sum = 0;
    r = 0;
    for (i = 0; i < 10; i++) {
	clo = clock();
	for (j = 0; j < TIC_COUNT; j++) {
	    for (k = 0; k < NUM_RANDS; k++) {
		r += dsfmt_gv_genrand_open_close();
	    }
	}
	clo = clock() - clo;
	sum += clo;
    }
    total = r;
    printf("GL SEQ (0, 1] 1 AVE:%4" PRIu64"ms.\n",
	   (sum * 100)  / CLOCKS_PER_SEC);
    sum = 0;
    for (i = 0; i < 10; i++) {
	clo = clock();
	for (j = 0; j < TIC_COUNT; j++) {
	    for (k = 0; k < NUM_RANDS; k++) {
		array[k] = dsfmt_gv_genrand_open_close();
	    }
	}
	clo = clock() - clo;
	sum += clo;
    }
    for (k = 0; k < NUM_RANDS; k++) {
	total += array[k];
    }
    printf("GL SEQ (0, 1] 2 AVE:%4" PRIu64"ms.\n",
	   (sum * 100)  / CLOCKS_PER_SEC);
#endif
    dsfmt_init_gen_rand(&dsfmt, 1234);
    sum = 0;
    r = 0;
    for (i = 0; i < 10; i++) {
        clo = clock();
        for (j = 0; j < TIC_COUNT; j++) {
            for (k = 0; k < NUM_RANDS; k++) {
                r += dsfmt_genrand_open_close(&dsfmt);
            }
        }
        clo = clock() - clo;
        sum += clo;
    }
    total += r;
    printf("ST SEQ (0, 1] 1 AVE:%4" PRIu64"ms.\n",
           (sum * 100)  / CLOCKS_PER_SEC);
    sum = 0;
    for (i = 0; i < 10; i++) {
        clo = clock();
        for (j = 0; j < TIC_COUNT; j++) {
            for (k = 0; k < NUM_RANDS; k++) {
                array[k] = dsfmt_genrand_open_close(&dsfmt);
            }
        }
        clo = clock() - clo;
        sum += clo;
    }
    for (k = 0; k < NUM_RANDS; k++) {
        total += array[k];
    }
    printf("ST SEQ (0, 1] 2 AVE:%4" PRIu64"ms.\n",
           (sum * 100)  / CLOCKS_PER_SEC);
    printf("total = %f\n", total);
}